

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O0

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char **begin,char *end)

{
  char **ppcVar1;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_RDX;
  char **in_RSI;
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *in_RDI;
  char *in_stack_ffffffffffffffd0;
  compiler_token_type local_4;
  
  ppcVar1 = eat_ws_<char_const*>(in_RDX,(char **)in_RDI,in_stack_ffffffffffffffd0);
  if ((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
       *)*ppcVar1 == in_RDX) {
    local_4 = token_end_of_pattern;
  }
  else {
    switch(**in_RSI) {
    case '$':
      *in_RSI = *in_RSI + 1;
      local_4 = token_assert_end_line;
      break;
    case '(':
      *in_RSI = *in_RSI + 1;
      local_4 = token_group_begin;
      break;
    case ')':
      *in_RSI = *in_RSI + 1;
      local_4 = token_group_end;
      break;
    case '*':
    case '+':
    case '?':
      local_4 = token_invalid_quantifier;
      break;
    case '.':
      *in_RSI = *in_RSI + 1;
      local_4 = token_any;
      break;
    case '[':
      *in_RSI = *in_RSI + 1;
      local_4 = token_charset_begin;
      break;
    case '\\':
      *in_RSI = *in_RSI + 1;
      local_4 = get_escape_token<char_const*>(in_RDI,in_RSI,(char *)in_RDX);
      break;
    case ']':
    case '{':
    default:
      local_4 = token_literal;
      break;
    case '^':
      *in_RSI = *in_RSI + 1;
      local_4 = token_assert_begin_line;
      break;
    case '|':
      *in_RSI = *in_RSI + 1;
      local_4 = token_alternate;
    }
  }
  return local_4;
}

Assistant:

regex_constants::compiler_token_type get_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        if(this->eat_ws_(begin, end) == end)
        {
            return regex_constants::token_end_of_pattern;
        }

        switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, '\\'): return this->get_escape_token(++begin, end);
        case BOOST_XPR_CHAR_(char_type, '.'): ++begin; return token_any;
        case BOOST_XPR_CHAR_(char_type, '^'): ++begin; return token_assert_begin_line;
        case BOOST_XPR_CHAR_(char_type, '$'): ++begin; return token_assert_end_line;
        case BOOST_XPR_CHAR_(char_type, '('): ++begin; return token_group_begin;
        case BOOST_XPR_CHAR_(char_type, ')'): ++begin; return token_group_end;
        case BOOST_XPR_CHAR_(char_type, '|'): ++begin; return token_alternate;
        case BOOST_XPR_CHAR_(char_type, '['): ++begin; return token_charset_begin;

        case BOOST_XPR_CHAR_(char_type, '*'):
        case BOOST_XPR_CHAR_(char_type, '+'):
        case BOOST_XPR_CHAR_(char_type, '?'):
            return token_invalid_quantifier;

        case BOOST_XPR_CHAR_(char_type, ']'):
        case BOOST_XPR_CHAR_(char_type, '{'):
        default:
            return token_literal;
        }
    }